

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_function.h
# Opt level: O2

type dukglue::detail::FuncInfoHolder<std::__cxx11::string_const&>::FuncRuntime::
     actually_call<std::__cxx11::string_const&>
               (duk_context *ctx,
               _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
               *funcToCall,tuple<> *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char *local_30 [4];
  
  pbVar1 = (*funcToCall)();
  std::__cxx11::string::string((string *)local_30,(string *)pbVar1);
  duk_push_string(ctx,local_30[0]);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

static typename std::enable_if<!std::is_void<Dummy>::value>::type actually_call(duk_context* ctx, RetType(*funcToCall)(Ts...), const std::tuple<BakedTs...>& args)
				{
					// ArgStorage has some static_asserts in it that validate value types,
					// so we typedef it to force ArgStorage<RetType> to compile and run the asserts
					typedef typename dukglue::types::ArgStorage<RetType>::type ValidateReturnType;

					RetType return_val = dukglue::detail::apply_fp(funcToCall, args);

					using namespace dukglue::types;
					DukType<typename Bare<RetType>::type>::template push<RetType>(ctx, std::move(return_val));
				}